

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

int back_to_cmap(level *lev,xchar x,xchar y)

{
  rm *loc;
  bool bVar1;
  int local_30;
  rm *ptr;
  int idx;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  loc = lev->locations[x] + y;
  switch(loc->typ) {
  case '\0':
  case '\x10':
    ptr._0_4_ = 1;
    if ((*(uint *)&(lev->flags).field_0x8 >> 0x14 & 1) != 0) {
      ptr._0_4_ = 0x1e;
    }
    break;
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '\x0f':
    if (loc->seenv == '\0') {
      local_30 = 1;
    }
    else {
      local_30 = wall_angle(loc);
    }
    ptr._0_4_ = local_30;
    break;
  case '\f':
    ptr._0_4_ = 0x2e;
    if ((*(uint *)&loc->field_0x6 >> 9 & 1) != 0) {
      ptr._0_4_ = 0x2f;
    }
    break;
  case '\r':
    ptr._0_4_ = 0x1e;
    break;
  case '\x0e':
    ptr._0_4_ = 0x1f;
    break;
  case '\x11':
  case '\x12':
    ptr._0_4_ = 0x11;
    break;
  case '\x13':
    ptr._0_4_ = 0x14;
    break;
  case '\x14':
    switch(*(uint *)&loc->field_0x6 >> 4 & 0x1c) {
    case 0:
      ptr._0_4_ = 0x11;
      break;
    case 4:
      ptr._0_4_ = 0x17;
      break;
    case 8:
      ptr._0_4_ = 0x15;
      break;
    case 0xc:
      bVar1 = false;
      if ((viz_array[y][x] & 2U) == 0) {
        bVar1 = (*(uint *)&loc->field_0x6 >> 0xb & 1) == 0;
      }
      ptr._0_4_ = 0xf;
      if (bVar1) {
        ptr._0_4_ = 0x10;
      }
      break;
    case 0x10:
      ptr._0_4_ = 0x16;
      break;
    default:
      impossible("Strange db-under: %d",(ulong)(*(uint *)&loc->field_0x6 >> 4 & 0x1c));
      ptr._0_4_ = 0xf;
    }
    break;
  case '\x15':
    ptr._0_4_ = 0x17;
    break;
  case '\x16':
    ptr._0_4_ = 0x1d;
    break;
  case '\x17':
    if ((*(uint *)&loc->field_0x6 >> 4 & 0x1f) == 0) {
      ptr._0_4_ = 0x18;
    }
    else if ((*(uint *)&loc->field_0x6 >> 4 & 1) == 0) {
      if ((*(uint *)&loc->field_0x6 >> 4 & 2) == 0) {
        ptr._0_4_ = 0x1b;
        if ((*(uint *)&loc->field_0x6 >> 9 & 1) != 0) {
          ptr._0_4_ = 0x1c;
        }
      }
      else {
        ptr._0_4_ = 0x19;
        if ((*(uint *)&loc->field_0x6 >> 9 & 1) != 0) {
          ptr._0_4_ = 0x1a;
        }
      }
    }
    else {
      ptr._0_4_ = 0x18;
    }
    break;
  case '\x18':
    ptr._0_4_ = 0xd;
    if ((*(uint *)&loc->field_0x6 >> 0xb & 1) != 0 || flags.lit_corridor != '\0') {
      ptr._0_4_ = 0xe;
    }
    break;
  case '\x19':
    bVar1 = false;
    if ((viz_array[y][x] & 2U) == 0) {
      bVar1 = (*(uint *)&loc->field_0x6 >> 0xb & 1) == 0;
    }
    ptr._0_4_ = 0xf;
    if (bVar1) {
      ptr._0_4_ = 0x10;
    }
    break;
  case '\x1a':
    if (((lev->sstairs).sx == x) && ((lev->sstairs).sy == y)) {
      ptr._0_4_ = 0x24;
      if ((*(uint *)&loc->field_0x6 >> 4 & 2) != 0) {
        ptr._0_4_ = 0x25;
      }
    }
    else {
      ptr._0_4_ = 0x20;
      if ((*(uint *)&loc->field_0x6 >> 4 & 2) != 0) {
        ptr._0_4_ = 0x21;
      }
    }
    break;
  case '\x1b':
    ptr._0_4_ = 0x22;
    if ((*(uint *)&loc->field_0x6 >> 4 & 2) != 0) {
      ptr._0_4_ = 0x23;
    }
    break;
  case '\x1c':
    ptr._0_4_ = 0x2b;
    break;
  case '\x1d':
    ptr._0_4_ = 0x28;
    break;
  case '\x1e':
    ptr._0_4_ = 0x29;
    break;
  case '\x1f':
    ptr._0_4_ = 0x2a;
    break;
  case ' ':
    ptr._0_4_ = 0x27;
    break;
  case '!':
    ptr._0_4_ = 0x26;
    break;
  case '\"':
    ptr._0_4_ = 0x15;
    break;
  case '#':
    ptr._0_4_ = 0x16;
    break;
  case '$':
    ptr._0_4_ = 0x2c;
    if ((*(uint *)&loc->field_0x6 >> 9 & 1) != 0) {
      ptr._0_4_ = 0x2d;
    }
    break;
  case '%':
    ptr._0_4_ = 0x12;
    break;
  case '&':
    ptr._0_4_ = 0x13;
    break;
  default:
    impossible("back_to_cmap:  unknown location type [ = %d ]",(ulong)(uint)(int)loc->typ);
    ptr._0_4_ = 0xf;
  }
  return (int)ptr;
}

Assistant:

int back_to_cmap(struct level *lev, xchar x, xchar y)
{
    int idx;
    struct rm *ptr = &(lev->locations[x][y]);

    switch (ptr->typ) {
	case SCORR:
	case STONE:
	    idx = lev->flags.arboreal ? S_tree : S_stone;
	    break;
	case ROOM:
	    idx = (!cansee(x,y) && !ptr->waslit) ? S_darkroom : S_room;
	    break;
	case CORR:
	    idx = (ptr->waslit || flags.lit_corridor) ? S_litcorr : S_corr;
	    break;
	case HWALL:
	case VWALL:
	case TLCORNER:
	case TRCORNER:
	case BLCORNER:
	case BRCORNER:
	case CROSSWALL:
	case TUWALL:
	case TDWALL:
	case TLWALL:
	case TRWALL:
	case SDOOR:
	    idx = ptr->seenv ? wall_angle(ptr) : S_stone;
	    break;
	case DOOR:
	    if (ptr->doormask) {
		if (ptr->doormask & D_BROKEN)
		    idx = S_ndoor;
		else if (ptr->doormask & D_ISOPEN)
		    idx = (ptr->horizontal) ? S_hodoor : S_vodoor;
		else			/* else is closed */
		    idx = (ptr->horizontal) ? S_hcdoor : S_vcdoor;
	    } else
		idx = S_ndoor;
	    break;
	case IRONBARS:		idx = S_bars;     break;
	case TREE:		idx = S_tree;     break;
	case DEADTREE:		idx = S_deadtree; break;
	case POOL:
	case MOAT:		idx = S_pool;	  break;
	case STAIRS:
            if (lev->sstairs.sx == x && lev->sstairs.sy == y)
                idx = (ptr->ladder & LA_DOWN) ? S_dnsstair : S_upsstair;
            else
                idx = (ptr->ladder & LA_DOWN) ? S_dnstair : S_upstair;
	    break;
	case LADDER:
	    idx = (ptr->ladder & LA_DOWN) ? S_dnladder : S_upladder;
	    break;
	case FOUNTAIN:		idx = S_fountain; break;
	case SINK:		idx = S_sink;     break;
	case ALTAR:		idx = S_altar;    break;
	case GRAVE:		idx = S_grave;    break;
	case THRONE:		idx = S_throne;   break;
	case MAGIC_CHEST:	idx = S_magic_chest; break;
	case LAVAPOOL:		idx = S_lava;	  break;
	case ICE:		idx = S_ice;      break;
	case AIR:		idx = S_air;	  break;
	case CLOUD:		idx = S_cloud;	  break;
	case WATER:		idx = S_water;	  break;
	case BOG:		idx = S_bog;	  break;
	case DBWALL:
	    idx = (ptr->horizontal) ? S_hcdbridge : S_vcdbridge;
	    break;
	case DRAWBRIDGE_UP:
	    switch(ptr->drawbridgemask & DB_UNDER) {
	    case DB_MOAT:  idx = S_pool; break;
	    case DB_LAVA:  idx = S_lava; break;
	    case DB_ICE:   idx = S_ice;  break;
	    case DB_FLOOR: idx = (!cansee(x,y) && !ptr->waslit) ? S_darkroom : S_room; break;
	    case DB_BOG:   idx = S_bog;  break;
	    default:
		impossible("Strange db-under: %d",
			   ptr->drawbridgemask & DB_UNDER);
		idx = S_room; /* something is better than nothing */
		break;
	    }
	    break;
	case DRAWBRIDGE_DOWN:
	    idx = (ptr->horizontal) ? S_hodbridge : S_vodbridge;
	    break;
	default:
	    impossible("back_to_cmap:  unknown location type [ = %d ]", ptr->typ);
	    idx = S_room;
	    break;
    }

    return idx;
}